

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

commonNaNT * floatx80ToCommonNaN(commonNaNT *__return_storage_ptr__,floatx80 a,float_status *status)

{
  uint64_t uVar1;
  bool bVar2;
  
  if (status->snan_bit_is_one == '\0') {
    bVar2 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0 &&
            ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
  }
  else {
    bVar2 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0;
  }
  if (((a._8_4_ & 0x7fff) == 0x7fff) && (bVar2)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if ((long)a.low < 0) {
    __return_storage_ptr__->sign = (flag)((a._8_8_ & 0xffff) >> 0xf);
    __return_storage_ptr__->low = 0;
    uVar1 = a.low * 2;
  }
  else {
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips64el(float_status *)");
    }
    __return_storage_ptr__->sign = '\x01';
    __return_storage_ptr__->low = 0;
    uVar1 = 0x8000000000000000;
  }
  __return_storage_ptr__->high = uVar1;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT floatx80ToCommonNaN(floatx80 a, float_status *status)
{
    floatx80 dflt;
    commonNaNT z;

    if (floatx80_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    if (a.low >> 63) {
        z.sign = a.high >> 15;
        z.low = 0;
        z.high = a.low << 1;
    } else {
        dflt = floatx80_default_nan(status);
        z.sign = dflt.high >> 15;
        z.low = 0;
        z.high = dflt.low << 1;
    }
    return z;
}